

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

void __thiscall wallet::InternalRecord::Unserialize<AutoFile>(InternalRecord *this,AutoFile *s)

{
  long lVar1;
  undefined4 uVar2;
  byte *begin;
  size_t in_RCX;
  AutoFile *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  Span<std::byte> SVar3;
  undefined4 in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  uint *in_stack_ffffffffffffffb0;
  AutoFile *in_stack_ffffffffffffffb8;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_ffffffffffffffc8;
  void *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,(uchar *)in_stack_ffffffffffffffb0);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  AutoFile::operator>>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::vector<std::byte,_std::allocator<std::byte>_>::resize
            (in_stack_ffffffffffffffc8,(size_type)in_RDI);
  begin = std::vector<std::byte,_std::allocator<std::byte>_>::data
                    ((vector<std::byte,_std::allocator<std::byte>_> *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::vector<std::byte,_std::allocator<std::byte>_>::size
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  Span<std::byte>::Span<std::byte,_0>
            ((Span<std::byte> *)in_RSI,begin,
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  SVar3.m_size = (size_t)in_stack_ffffffffffffffc8;
  SVar3.m_data = in_RDI;
  SVar3 = AsWritableBytes<std::byte>(SVar3);
  local_30 = (void *)SVar3.m_size;
  AutoFile::read(in_RSI,(int)SVar3.m_data,local_30,in_RCX);
  if ((in_RDI[4] & 1) != 0) {
    uVar2 = internal_bswap_32(in_stack_ffffffffffffffac);
    *(undefined4 *)(in_RDI + 8) = uVar2;
    uVar2 = internal_bswap_32(in_stack_ffffffffffffffac);
    *(undefined4 *)(in_RDI + 0xc) = uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> unused;
        s >> page_num;
        s >> records;

        data.resize(m_header.len);
        s.read(AsWritableBytes(Span(data.data(), data.size())));

        if (m_header.other_endian) {
            page_num = internal_bswap_32(page_num);
            records = internal_bswap_32(records);
        }
    }